

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_group(Decompiler *this,uint16_t read_index)

{
  char local_14 [2];
  uint16_t local_12;
  Decompiler *pDStack_10;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  local_12 = read_index;
  pDStack_10 = this;
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_14[1] = 0x28;
  OutStream::push<char>(this->out_stream,local_14 + 1,local_12);
  write_expression_head(this,local_12);
  write_expression_tail(this,local_12,false,false);
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_14[0] = ')';
  OutStream::operator<<(this->out_stream,local_14);
  return;
}

Assistant:

void Decompiler::write_group(uint16_t read_index)
{
    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    write_expression_tail(read_index, false);

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
}